

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

void __thiscall
cmComputeTargetDepends::AddTargetDepend
          (cmComputeTargetDepends *this,int depender_index,cmTarget *dependee,bool linking)

{
  _Rb_tree_header *p_Var1;
  undefined8 in_RAX;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *psVar2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  cmGraphEdge local_28;
  
  if ((dependee->IsImportedTarget == false) && (dependee->TargetTypeValue != INTERFACE_LIBRARY)) {
    p_Var1 = &(this->TargetIndex)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = (this->TargetIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var4 = &p_Var1->_M_header;
    for (; p_Var5 != (_Base_ptr)0x0;
        p_Var5 = (&p_Var5->_M_left)[*(cmTarget **)(p_Var5 + 1) < dependee]) {
      if (*(cmTarget **)(p_Var5 + 1) >= dependee) {
        p_Var4 = p_Var5;
      }
    }
    p_Var5 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
       (p_Var5 = p_Var4, dependee < *(cmTarget **)(p_Var4 + 1))) {
      p_Var5 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var5 == p_Var1) {
      __assert_fail("tii != this->TargetIndex.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmComputeTargetDepends.cxx"
                    ,0x1b9,
                    "void cmComputeTargetDepends::AddTargetDepend(int, const cmTarget *, bool)");
    }
    local_28._5_3_ = SUB83((ulong)in_RAX >> 0x28,0);
    local_28.Strong = !linking;
    local_28.Dest = *(int *)&p_Var5[1]._M_parent;
    std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::emplace_back<cmGraphEdge>
              (&(this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>
                .super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                super__Vector_impl_data._M_start[depender_index].
                super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>,&local_28);
  }
  else {
    psVar2 = cmTarget::GetUtilityItems(dependee);
    for (p_Var3 = (psVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(psVar2->_M_t)._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      if (*(cmTarget **)(p_Var3 + 2) != (cmTarget *)0x0) {
        AddTargetDepend(this,depender_index,*(cmTarget **)(p_Var3 + 2),false);
      }
    }
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddTargetDepend(int depender_index,
                                             cmTarget const* dependee,
                                             bool linking)
{
  if(dependee->IsImported() ||
     dependee->GetType() == cmTarget::INTERFACE_LIBRARY)
    {
    // Skip IMPORTED and INTERFACE targets but follow their utility
    // dependencies.
    std::set<cmLinkItem> const& utils = dependee->GetUtilityItems();
    for(std::set<cmLinkItem>::const_iterator i = utils.begin();
        i != utils.end(); ++i)
      {
      if(cmTarget const* transitive_dependee = i->Target)
        {
        this->AddTargetDepend(depender_index, transitive_dependee, false);
        }
      }
    }
  else
    {
    // Lookup the index for this target.  All targets should be known by
    // this point.
    std::map<cmTarget const*, int>::const_iterator tii =
      this->TargetIndex.find(dependee);
    assert(tii != this->TargetIndex.end());
    int dependee_index = tii->second;

    // Add this entry to the dependency graph.
    this->InitialGraph[depender_index].push_back(
      cmGraphEdge(dependee_index, !linking));
    }
}